

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O1

void __thiscall
OnDiskDataset::execute(OnDiskDataset *this,Query *query,ResultWriter *out,QueryCounters *counters)

{
  pointer pOVar1;
  FileId *pFVar2;
  source_loc loc;
  pointer pQVar3;
  logger *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  OnDiskIndex *ndx;
  pointer pOVar5;
  FileId *pFVar6;
  string_view_t fmt;
  pair<std::__detail::_Node_iterator<IndexType,_true,_false>,_bool> pVar7;
  QueryResult result;
  unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
  types_to_query;
  _Any_data local_138;
  PrimitiveQuery local_128;
  code *pcStack_120;
  pointer local_110;
  Query local_108;
  QueryCounters *local_c0;
  undefined1 local_b8 [48];
  vector<Query,_std::allocator<Query>_> local_88;
  _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pOVar5 = (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar1 = (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_110 = (pointer)out;
  local_c0 = counters;
  if (pOVar5 != pOVar1) {
    do {
      local_108.type = pOVar5->ntype;
      pVar7 = std::
              _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_emplace<IndexType>(&local_68,&local_108,out);
      out = pVar7._8_8_;
      pOVar5 = pOVar5 + 1;
    } while (pOVar5 != pOVar1);
  }
  Query::plan(&local_108,query,
              (unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
               *)&local_68);
  q_optimize((Query *)local_b8,&local_108);
  local_128 = (PrimitiveQuery)
              local_108.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_138._8_8_ =
       local_108.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_138._M_unused._M_object =
       local_108.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_108.type = local_b8._0_4_;
  local_108.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_b8._8_8_;
  local_108.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_b8._16_8_;
  local_108.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._24_8_;
  local_b8._8_8_ = (pointer)0x0;
  local_b8._16_8_ = (pointer)0x0;
  local_b8._24_8_ = (pointer)0x0;
  std::vector<QToken,_std::allocator<QToken>_>::~vector
            ((vector<QToken,_std::allocator<QToken>_> *)&local_138);
  local_128 = (PrimitiveQuery)
              local_108.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_138._8_8_ =
       local_108.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_138._M_unused._M_object =
       local_108.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_108.ngram.itype = local_b8._32_4_;
  local_108.ngram.trigram = local_b8._36_4_;
  local_108.count = local_b8._40_4_;
  local_108.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_108.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_108.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Query,_std::allocator<Query>_>::~vector
            ((vector<Query,_std::allocator<Query>_> *)&local_138);
  std::vector<Query,_std::allocator<Query>_>::~vector(&local_88);
  std::vector<QToken,_std::allocator<QToken>_>::~vector
            ((vector<QToken,_std::allocator<QToken>_> *)(local_b8 + 8));
  this_00 = spdlog::default_logger_raw();
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  local_b8._16_8_ = (pointer)0x0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 8;
  fmt.data_ = "PLAN: {}";
  spdlog::logger::log<Query>(this_00,loc,debug,fmt,&local_108);
  OnDiskDataset::query((QueryResult *)local_b8,this,&local_108,local_c0);
  if (local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ == true) {
    local_138._8_8_ = (pointer)0x0;
    local_138._M_unused._M_object = &local_110;
    pcStack_120 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:109:13)>
                  ::_M_invoke;
    local_128 = (PrimitiveQuery)
                std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:109:13)>
                ::_M_manager;
    OnDiskFileIndex::for_each_filename
              ((OnDiskFileIndex *)&this->files_index,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_138);
    if (local_128 != (PrimitiveQuery)0x0) {
      (*(code *)local_128)(&local_138,&local_138,3);
    }
  }
  else {
    pvVar4 = SortedRun::decompressed((SortedRun *)local_b8);
    pFVar6 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pFVar2 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar6 != pFVar2) {
      do {
        pQVar3 = local_110;
        OnDiskFileIndex::get_file_name_abi_cxx11_
                  ((string *)&local_138,(OnDiskFileIndex *)&this->files_index,*pFVar6);
        (**(_func_int **)
           ((long)(pQVar3->opts_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + 0x10))(pQVar3,&local_138);
        if ((pointer)local_138._M_unused._0_8_ != (pointer)&local_128) {
          operator_delete(local_138._M_unused._M_object,(ulong)((long)(QueryType *)local_128 + 1));
        }
        pFVar6 = pFVar6 + 1;
      } while (pFVar6 != pFVar2);
    }
  }
  if ((pointer)local_b8._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._24_8_,
                    CONCAT44(local_b8._44_4_,local_b8._40_4_) - local_b8._24_8_);
  }
  if ((pointer)local_b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
  }
  std::vector<Query,_std::allocator<Query>_>::~vector(&local_108.queries);
  std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_108.value);
  std::
  _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void OnDiskDataset::execute(const Query &query, ResultWriter *out,
                            QueryCounters *counters) const {
    std::unordered_set<IndexType> types_to_query;
    for (const auto &ndx : get_indexes()) {
        types_to_query.emplace(ndx.index_type());
    }
    Query plan = query.plan(types_to_query);
    plan = q_optimize(std::move(plan));
    spdlog::debug("PLAN: {}", plan);

    QueryResult result = this->query(plan, counters);
    if (result.is_everything()) {
        files_index->for_each_filename(
            [&out](const std::string &fname) { out->push_back(fname); });
    } else {
        for (const auto &fid : result.vector().decompressed()) {
            out->push_back(get_file_name(fid));
        }
    }
}